

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<ExternMemberInfo,_false,_false>::push_back
          (FastVector<ExternMemberInfo,_false,_false> *this,ExternMemberInfo *valPtr,uint elem)

{
  ExternMemberInfo *pEVar1;
  undefined8 uVar2;
  ExternMemberInfo *pEVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = this->count + elem;
  if (uVar5 < this->max) {
    for (lVar4 = 0; (ulong)elem * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
      pEVar1 = this->data;
      uVar5 = this->count;
      this->count = uVar5 + 1;
      pEVar1[uVar5].offset = *(uint *)((long)&valPtr->offset + lVar4);
      uVar2 = *(undefined8 *)((long)&valPtr->type + lVar4);
      pEVar1 = pEVar1 + uVar5;
      pEVar1->type = (int)uVar2;
      pEVar1->alignment = (int)((ulong)uVar2 >> 0x20);
    }
    return;
  }
  pEVar1 = this->data;
  grow_no_destroy(this,uVar5);
  for (lVar4 = 0; (ulong)elem * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    pEVar3 = this->data;
    uVar5 = this->count;
    this->count = uVar5 + 1;
    pEVar3[uVar5].offset = *(uint *)((long)&valPtr->offset + lVar4);
    uVar2 = *(undefined8 *)((long)&valPtr->type + lVar4);
    pEVar3 = pEVar3 + uVar5;
    pEVar3->type = (int)uVar2;
    pEVar3->alignment = (int)((ulong)uVar2 >> 0x20);
  }
  if (pEVar1 != (ExternMemberInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar1);
    return;
  }
  return;
}

Assistant:

__forceinline void push_back(const T* valPtr, unsigned elem)
	{
		if(count + elem >= max)
		{
			grow_and_add(count + elem, valPtr, elem);
			return;
		}

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];
	}